

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommand::LoadPackageRegistryDir
          (cmFindPackageCommand *this,string *dir,cmSearchPath *outPaths)

{
  cmFindPackageCommandHoldFile cVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  undefined1 local_290 [8];
  string fentry;
  ifstream fin;
  cmFindPackageCommandHoldFile local_68;
  cmFindPackageCommandHoldFile holdFile;
  unsigned_long i;
  string fname;
  Directory local_28;
  Directory files;
  cmSearchPath *outPaths_local;
  string *dir_local;
  cmFindPackageCommand *this_local;
  
  files.Internal = (DirectoryInternals *)outPaths;
  cmsys::Directory::Directory(&local_28);
  bVar2 = cmsys::Directory::Load(&local_28,dir);
  if (bVar2) {
    std::__cxx11::string::string((string *)&i);
    for (holdFile.File = (char *)0x0; cVar1.File = holdFile.File,
        pcVar4 = (char *)cmsys::Directory::GetNumberOfFiles(&local_28), cVar1.File < pcVar4;
        holdFile.File = holdFile.File + 1) {
      std::__cxx11::string::operator=((string *)&i,(string *)dir);
      std::__cxx11::string::operator+=((string *)&i,"/");
      pcVar4 = cmsys::Directory::GetFile(&local_28,holdFile.File);
      std::__cxx11::string::operator+=((string *)&i,pcVar4);
      bVar2 = cmsys::SystemTools::FileIsDirectory((string *)&i);
      if (!bVar2) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmFindPackageCommandHoldFile::cmFindPackageCommandHoldFile(&local_68,pcVar4);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        _Var3 = std::operator|(_S_in,_S_bin);
        std::ifstream::ifstream((void *)((long)&fentry.field_2 + 8),pcVar4,_Var3);
        std::__cxx11::string::string((string *)local_290);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)((long)&fentry.field_2 +
                                  *(long *)(fentry.field_2._8_8_ + -0x18) + 8));
        if (((bVar2) &&
            (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)(fentry.field_2._M_local_buf + 8),(string *)local_290,
                                (bool *)0x0,-1), bVar2)) &&
           (bVar2 = CheckPackageRegistryEntry
                              (this,(string *)local_290,(cmSearchPath *)files.Internal), bVar2)) {
          cmFindPackageCommandHoldFile::Release(&local_68);
        }
        std::__cxx11::string::~string((string *)local_290);
        std::ifstream::~ifstream((void *)((long)&fentry.field_2 + 8));
        cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile(&local_68);
      }
    }
    std::__cxx11::string::~string((string *)&i);
    fname.field_2._8_4_ = 0;
  }
  else {
    fname.field_2._8_4_ = 1;
  }
  cmsys::Directory::~Directory(&local_28);
  return;
}

Assistant:

void cmFindPackageCommand::LoadPackageRegistryDir(std::string const& dir,
                                                  cmSearchPath& outPaths)
{
  cmsys::Directory files;
  if (!files.Load(dir)) {
    return;
  }

  std::string fname;
  for (unsigned long i = 0; i < files.GetNumberOfFiles(); ++i) {
    fname = dir;
    fname += "/";
    fname += files.GetFile(i);

    if (!cmSystemTools::FileIsDirectory(fname)) {
      // Hold this file hostage until it behaves.
      cmFindPackageCommandHoldFile holdFile(fname.c_str());

      // Load the file.
      cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
      std::string fentry;
      if (fin && cmSystemTools::GetLineFromStream(fin, fentry) &&
          this->CheckPackageRegistryEntry(fentry, outPaths)) {
        // The file references an existing package, so release it.
        holdFile.Release();
      }
    }
  }

  // TODO: Wipe out the directory if it is empty.
}